

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O1

bool __thiscall Filesystem::add_fcb(Filesystem *this,int firstId,Fcb fcb)

{
  Fat *pFVar1;
  iterator iVar2;
  Document *this_00;
  uint uVar3;
  int i;
  int iVar4;
  long lVar5;
  
  pFVar1 = this->pfat1;
  if (pFVar1->filelist[firstId] == 0) {
    pFVar1->filelist[firstId] = 0xffff;
  }
  do {
    uVar3 = firstId;
    firstId = (uint)pFVar1->filelist[(int)uVar3];
  } while (pFVar1->filelist[(int)uVar3] != 0xffff);
  this_00 = (Document *)operator_new(0x20);
  Document::Document(this_00,this->blocks[(int)uVar3]);
  iVar2._M_current =
       (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((ulong)((long)iVar2._M_current +
             (-0x3d8 - (long)(this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>.
                             _M_impl.super__Vector_impl_data._M_start)) < 0xfffffffffffffc00) {
    pFVar1 = this->pfat1;
    lVar5 = 6;
    do {
      if (pFVar1->filelist[lVar5] == 0) goto LAB_00107580;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 1000);
    lVar5 = 0xffffffff;
LAB_00107580:
    iVar4 = (int)lVar5;
    if (iVar4 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Err]Current content is full!",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
    }
    else {
      pFVar1->filelist[(int)uVar3] = (Filelist)lVar5;
      pFVar1->filelist[iVar4] = 0xffff;
      Document::~Document(this_00);
      operator_delete(this_00,0x20);
      this_00 = (Document *)operator_new(0x20);
      Document::Document(this_00,this->blocks[(int)uVar3]);
      iVar2._M_current =
           (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Fcb,std::allocator<Fcb>>::_M_realloc_insert<Fcb_const&>
                  ((vector<Fcb,std::allocator<Fcb>> *)this_00,iVar2,&fcb);
      }
      else {
        (iVar2._M_current)->free = fcb.free;
        *(undefined7 *)&(iVar2._M_current)->field_0x21 = fcb._33_7_;
        (iVar2._M_current)->first = fcb.first;
        *(undefined4 *)&(iVar2._M_current)->field_0x14 = fcb._20_4_;
        (iVar2._M_current)->length = fcb.length;
        *&(iVar2._M_current)->filename = fcb.filename;
        (iVar2._M_current)->exname[0] = fcb.exname[0];
        (iVar2._M_current)->exname[1] = fcb.exname[1];
        (iVar2._M_current)->exname[2] = fcb.exname[2];
        (iVar2._M_current)->attribute = fcb.attribute;
        (iVar2._M_current)->time = fcb.time;
        (iVar2._M_current)->date = fcb.date;
        (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    if (iVar4 == -1) {
      return false;
    }
  }
  else if (iVar2._M_current ==
           (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
    std::vector<Fcb,std::allocator<Fcb>>::_M_realloc_insert<Fcb_const&>
              ((vector<Fcb,std::allocator<Fcb>> *)this_00,iVar2,&fcb);
  }
  else {
    (iVar2._M_current)->free = fcb.free;
    *(undefined7 *)&(iVar2._M_current)->field_0x21 = fcb._33_7_;
    (iVar2._M_current)->first = fcb.first;
    *(undefined4 *)&(iVar2._M_current)->field_0x14 = fcb._20_4_;
    (iVar2._M_current)->length = fcb.length;
    *&(iVar2._M_current)->filename = fcb.filename;
    (iVar2._M_current)->exname[0] = fcb.exname[0];
    (iVar2._M_current)->exname[1] = fcb.exname[1];
    (iVar2._M_current)->exname[2] = fcb.exname[2];
    (iVar2._M_current)->attribute = fcb.attribute;
    (iVar2._M_current)->time = fcb.time;
    (iVar2._M_current)->date = fcb.date;
    (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar2._M_current + 1;
  }
  Document::~Document(this_00);
  operator_delete(this_00,0x20);
  return true;
}

Assistant:

bool Filesystem::add_fcb(int firstId,Fcb fcb)
{
    ///Step1
    int lastId = firstId;
    if ((*pfat1)[lastId]== FREE)
    {
        (*pfat1)[lastId]= END;
    }
    while ((*pfat1)[lastId] != END) {
        lastId = (*pfat1)[lastId];
    }
    Document* plastDoc = new Document(blocks[lastId]);

    if((plastDoc->fcbList.size()+1)*sizeof(Fcb)>= BLOCKSIZE)
    {
        int freeBlock = pfat1->get_FreeBlock();
        if (freeBlock==FULL)
        {
            cout << "[Err]Current content is full!"<<endl;
            return false;
        }
        (*pfat1)[lastId] = freeBlock;
        (*pfat1)[freeBlock] = END;
        delete plastDoc;
        plastDoc = new Document(blocks[lastId]);
    ///Step2
        plastDoc->fcbList.push_back(fcb);
    }
    else
    {
        plastDoc->fcbList.push_back(fcb);
    }
#ifdef DEBUG
    //cout << "size:" << plastDoc->fcbList.size()<<endl;
    //cout << plastDoc->fcbList[0].filename<<endl;
#endif

    delete plastDoc;
    return true;

}